

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsp_helper.c
# Opt level: O2

int32_t mipsdsp_mul_q15_q15(int32_t ac,uint16_t a,uint16_t b,CPUMIPSState_conflict5 *env)

{
  target_ulong *ptVar1;
  
  if (b == 0x8000 && a == 0x8000) {
    ptVar1 = &(env->active_tc).DSPControl;
    *ptVar1 = *ptVar1 | 1L << ((char)ac + 0x10U & 0x3f);
    return 0x7fffffff;
  }
  return (int)(short)b * (int)(short)a * 2;
}

Assistant:

static inline int32_t mipsdsp_mul_q15_q15(int32_t ac, uint16_t a, uint16_t b,
                                          CPUMIPSState *env)
{
    int32_t temp;

    if ((a == 0x8000) && (b == 0x8000)) {
        temp = 0x7FFFFFFF;
        set_DSPControl_overflow_flag(1, 16 + ac, env);
    } else {
        temp = ((int16_t)a * (int16_t)b) << 1;
    }

    return temp;
}